

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O2

void Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1rstate_1set
               (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_,jstring jarg2)

{
  char *__s;
  size_t sVar1;
  char *__dest;
  
  if (jarg2 == (jstring)0x0) {
    __s = (char *)0x0;
  }
  else {
    __s = (*jenv->functions->GetStringUTFChars)(jenv,jarg2,(jboolean *)0x0);
    if (__s == (char *)0x0) {
      return;
    }
  }
  if (*(void **)(jarg1 + 0x48) != (void *)0x0) {
    operator_delete__(*(void **)(jarg1 + 0x48));
  }
  if (__s == (char *)0x0) {
    *(undefined8 *)(jarg1 + 0x48) = 0;
    return;
  }
  sVar1 = strlen(__s);
  __dest = (char *)operator_new__(sVar1 + 1);
  *(char **)(jarg1 + 0x48) = __dest;
  strcpy(__dest,__s);
  (*jenv->functions->ReleaseStringUTFChars)(jenv,jarg2,__s);
  return;
}

Assistant:

SWIGEXPORT void JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1rstate_1set(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_, jstring jarg2) {
  opt_s *arg1 = (opt_s *) 0 ;
  char *arg2 = (char *) 0 ;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  arg2 = 0;
  if (jarg2) {
    arg2 = (char *)jenv->GetStringUTFChars(jarg2, 0);
    if (!arg2) return ;
  }
  {
    delete [] arg1->rstate;
    if (arg2) {
      arg1->rstate = (char *) (new char[strlen((const char *)arg2)+1]);
      strcpy((char *)arg1->rstate, (const char *)arg2);
    } else {
      arg1->rstate = 0;
    }
  }
  if (arg2) jenv->ReleaseStringUTFChars(jarg2, (const char *)arg2);
}